

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O2

void __thiscall
duckdb_re2::SparseSetT<void>::MaybeInitializeMemory(SparseSetT<void> *this,int min,int max)

{
  int *piVar1;
  long lVar2;
  int i;
  
  piVar1 = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
           _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  for (lVar2 = (long)min; lVar2 < max; lVar2 = lVar2 + 1) {
    piVar1[lVar2] = -0x54545455;
  }
  return;
}

Assistant:

void MaybeInitializeMemory(int min, int max) {
#if __has_feature(memory_sanitizer)
    __msan_unpoison(sparse_.data() + min, (max - min) * sizeof sparse_[0]);
#elif defined(RE2_ON_VALGRIND)
    for (int i = min; i < max; i++) {
      sparse_[i] = 0xababababU;
    }
#endif
  }